

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O2

void __thiscall
glauber::DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
          (DeformedWoodsSaxonNucleus *this,size_t A,double R,double a,double beta2,double beta4)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM3_Qb;
  undefined1 auVar5 [16];
  
  Nucleus::Nucleus(&this->super_Nucleus,A);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = R;
  auVar1._8_8_ = in_XMM2_Qb;
  auVar1._0_8_ = beta2;
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar2._8_8_ = in_XMM3_Qb;
  auVar2._0_8_ = beta4;
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__Nucleus_00143ae0;
  this->R_ = R;
  this->a_ = a;
  this->beta2_ = beta2;
  auVar1 = vandpd_avx(auVar1,auVar3);
  auVar4 = vfmadd213sd_fma(ZEXT816(0x3fe428f5c28f5c29),auVar1,ZEXT816(0x3ff0000000000000));
  auVar1 = vandpd_avx(auVar2,auVar3);
  this->beta4_ = beta4;
  auVar1 = vfmadd132sd_fma(auVar1,auVar4,ZEXT816(0x3feb333333333333));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = a * 10.0;
  auVar1 = vfmadd231sd_fma(auVar4,auVar5,auVar1);
  this->rmax_ = auVar1._0_8_;
  return;
}

Assistant:

DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus(
    std::size_t A, double R, double a, double beta2, double beta4)
    : Nucleus(A),
      R_(R),
      a_(a),
      beta2_(beta2),
      beta4_(beta4),
      rmax_(R*(1. + .63*std::fabs(beta2) + .85*std::fabs(beta4)) + 10.*a)
{}